

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

bool __thiscall
World::CreatePlayer(World *this,string *username,secure_string *password,string *fullname,
                   string *location,string *email,string *computer,string *hdid,string *ip)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  mapped_type *this_00;
  time_t tVar7;
  allocator<char> local_e9;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Database_Result result;
  key_type local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"PasswordSalt",&local_e9);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_90);
  util::variant::GetString_abi_cxx11_(&local_70,this_00);
  std::operator+(&local_50,&local_70,username);
  std::operator+(&local_d0,&local_50,&password->str_);
  util::secure_string::secure_string((secure_string *)&result,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  sha256(&local_d0,(string *)&result);
  util::secure_string::operator=(password,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  util::secure_string::~secure_string((secure_string *)&result);
  pcVar1 = (username->_M_dataplus)._M_p;
  pcVar2 = (password->str_)._M_dataplus._M_p;
  pcVar3 = (fullname->_M_dataplus)._M_p;
  local_d8 = (location->_M_dataplus)._M_p;
  local_e0 = (email->_M_dataplus)._M_p;
  local_e8 = (computer->_M_dataplus)._M_p;
  pcVar4 = (hdid->_M_dataplus)._M_p;
  pcVar5 = (ip->_M_dataplus)._M_p;
  tVar7 = time((time_t *)0x0);
  Database::Query(&result,&this->db,
                  "INSERT INTO `accounts` (`username`, `password`, `fullname`, `location`, `email`, `computer`, `hdid`, `regip`, `created`) VALUES (\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',#)"
                  ,pcVar1,pcVar2,pcVar3,local_d8,local_e0,local_e8,pcVar4,pcVar5,tVar7);
  bVar6 = Database_Result::Error(&result);
  std::
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ::~vector(&result.
             super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           );
  return !bVar6;
}

Assistant:

bool World::CreatePlayer(const std::string& username, util::secure_string&& password,
	const std::string& fullname, const std::string& location, const std::string& email,
	const std::string& computer, const std::string& hdid, const std::string& ip)
{
	{
		util::secure_string password_buffer(std::move(std::string(this->config["PasswordSalt"]) + username + password.str()));
		password = sha256(password_buffer.str());
	}

	Database_Result result = this->db.Query("INSERT INTO `accounts` (`username`, `password`, `fullname`, `location`, `email`, `computer`, `hdid`, `regip`, `created`) VALUES ('$','$','$','$','$','$','$','$',#)",
		username.c_str(), password.str().c_str(), fullname.c_str(), location.c_str(), email.c_str(), computer.c_str(), hdid.c_str(), ip.c_str(), int(std::time(0)));

	return !result.Error();
}